

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::UmulExtendedCase::UmulExtendedCase
          (UmulExtendedCase *this,TestContext *testCtx,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  ShaderSpec *this_00;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *this_01;
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  shaderexecutor::(anonymous_namespace)::getIntegerFuncCaseName_abi_cxx11_
            (&local_68.name,(_anonymous_namespace_ *)(ulong)baseType,precision,shaderType,shaderType
            );
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,testCtx,local_68.name._M_dataplus._M_p,"umulExtended",
             shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_00c0dc68;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"x",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  this_00 = &(this->super_IntegerFunctionCase).m_spec;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"y",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(&this_00->inputs,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"msb",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  this_01 = &(this->super_IntegerFunctionCase).m_spec.outputs;
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_01,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"lsb",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
  emplace_back<vkt::shaderexecutor::Symbol>(this_01,&local_68);
  Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_IntegerFunctionCase).m_spec.source);
  return;
}

Assistant:

UmulExtendedCase (tcu::TestContext& testCtx, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase	(testCtx, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "umulExtended", shaderType)
	{
		m_spec.inputs.push_back(Symbol("x", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("y", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("msb", glu::VarType(baseType, precision)));
		m_spec.outputs.push_back(Symbol("lsb", glu::VarType(baseType, precision)));
		m_spec.source = "umulExtended(x, y, msb, lsb);";
	}